

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_10::LoadableGetStateBlock_x(ChElementTetraCorot_10 *this)

{
  ChState *in_RDX;
  int in_ESI;
  
  LoadableGetStateBlock_x
            ((ChElementTetraCorot_10 *)
             ((this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[-6] + -0x48 +
             (long)(&(this->super_ChElementCorotational).A + -1) + 0x40),in_ESI,in_RDX);
  return;
}

Assistant:

void ChElementTetraCorot_10::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = this->nodes[0]->GetPos().eigen();
    mD.segment(block_offset + 3, 3) = this->nodes[1]->GetPos().eigen();
    mD.segment(block_offset + 6, 3) = this->nodes[2]->GetPos().eigen();
    mD.segment(block_offset + 9, 3) = this->nodes[3]->GetPos().eigen();
    mD.segment(block_offset + 12, 3) = this->nodes[4]->GetPos().eigen();
    mD.segment(block_offset + 15, 3) = this->nodes[5]->GetPos().eigen();
    mD.segment(block_offset + 18, 3) = this->nodes[6]->GetPos().eigen();
    mD.segment(block_offset + 21, 3) = this->nodes[7]->GetPos().eigen();
    mD.segment(block_offset + 24, 3) = this->nodes[8]->GetPos().eigen();
    mD.segment(block_offset + 27, 3) = this->nodes[9]->GetPos().eigen();
}